

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int CBS_get_asn1_uint64_with_tag(CBS *cbs,uint64_t *out,CBS_ASN1_TAG tag)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  CBS bytes;
  CBS local_20;
  
  iVar1 = CBS_get_asn1(cbs,&local_20,tag);
  uVar3 = 0;
  if (iVar1 != 0) {
    iVar1 = CBS_is_unsigned_asn1_integer(&local_20);
    if (iVar1 != 0) {
      *out = 0;
      uVar2 = 0;
      uVar4 = 0;
      while ((local_20.len != uVar4 && (uVar2 >> 0x38 == 0))) {
        *out = uVar2 << 8;
        uVar2 = uVar2 << 8 | (ulong)local_20.data[uVar4];
        *out = uVar2;
        uVar4 = uVar4 + 1;
      }
      uVar3 = (uint)(local_20.len <= uVar4);
    }
  }
  return uVar3;
}

Assistant:

int CBS_get_asn1_uint64_with_tag(CBS *cbs, uint64_t *out, CBS_ASN1_TAG tag) {
  CBS bytes;
  if (!CBS_get_asn1(cbs, &bytes, tag) ||
      !CBS_is_unsigned_asn1_integer(&bytes)) {
    return 0;
  }

  *out = 0;
  const uint8_t *data = CBS_data(&bytes);
  size_t len = CBS_len(&bytes);
  for (size_t i = 0; i < len; i++) {
    if ((*out >> 56) != 0) {
      // Too large to represent as a uint64_t.
      return 0;
    }
    *out <<= 8;
    *out |= data[i];
  }

  return 1;
}